

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

label_set * __thiscall
mjs::interpreter::impl::get_labels
          (label_set *__return_storage_ptr__,impl *this,statement *current_statement)

{
  statement *current_statement_local;
  impl *this_local;
  label_set *ls;
  
  std::
  vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
  ::vector(__return_storage_ptr__);
  if (current_statement == this->labels_valid_for_) {
    std::
    swap<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::allocator<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>>
              (__return_storage_ptr__,&this->label_set_);
  }
  else {
    std::
    vector<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>,_std::allocator<std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>_>_>
    ::clear(&this->label_set_);
  }
  this->labels_valid_for_ = (statement *)0x0;
  return __return_storage_ptr__;
}

Assistant:

label_set get_labels(const statement& current_statement) {
        label_set ls;
        if (&current_statement == labels_valid_for_) {
            std::swap(ls, label_set_);
        } else {
            label_set_.clear();
        }
        labels_valid_for_ = nullptr;
        return ls;
    }